

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall
kj::_::TransformPromiseNodeBase::get(TransformPromiseNodeBase *this,ExceptionOrValue *output)

{
  NullableValue<kj::Exception> exception;
  Runnable local_2e0;
  Exception local_2d8;
  Maybe<kj::Exception> local_180;
  
  local_2e0._vptr_Runnable = (_func_int **)&PTR_run_0064ce18;
  local_2d8.ownFile.content.ptr = (char *)this;
  local_2d8.ownFile.content.size_ = (size_t)output;
  runCatchingExceptions(&local_180,&local_2e0);
  local_2e0._vptr_Runnable._0_1_ = local_180.ptr.isSet;
  if (local_180.ptr.isSet == true) {
    local_2d8.ownFile.content.ptr = local_180.ptr.field_1.value.ownFile.content.ptr;
    local_2d8.ownFile.content.size_ = local_180.ptr.field_1.value.ownFile.content.size_;
    local_2d8.ownFile.content.disposer = local_180.ptr.field_1.value.ownFile.content.disposer;
    local_180.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_180.ptr.field_1.value.ownFile.content.size_ = 0;
    local_2d8.file = local_180.ptr.field_1.value.file;
    local_2d8.line = local_180.ptr.field_1.value.line;
    local_2d8.type = local_180.ptr.field_1.value.type;
    local_2d8.description.content.ptr = local_180.ptr.field_1.value.description.content.ptr;
    local_2d8.description.content.size_ = local_180.ptr.field_1.value.description.content.size_;
    local_2d8.description.content.disposer =
         local_180.ptr.field_1.value.description.content.disposer;
    local_2d8.context.ptr.disposer = local_180.ptr.field_1.value.context.ptr.disposer;
    local_180.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_180.ptr.field_1.value.description.content.size_ = 0;
    local_2d8.context.ptr.ptr = local_180.ptr.field_1.value.context.ptr.ptr;
    local_180.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    memcpy(local_2d8.trace,(void *)((long)&local_180.ptr.field_1 + 0x50),0x104);
    Exception::~Exception(&local_180.ptr.field_1.value);
  }
  if ((char)local_2e0._vptr_Runnable == '\x01') {
    if ((output->exception).ptr.isSet == false) {
      (output->exception).ptr.field_1.value.ownFile.content.ptr = local_2d8.ownFile.content.ptr;
      (output->exception).ptr.field_1.value.ownFile.content.size_ = local_2d8.ownFile.content.size_;
      (output->exception).ptr.field_1.value.ownFile.content.disposer =
           local_2d8.ownFile.content.disposer;
      local_2d8.ownFile.content.ptr = (char *)0x0;
      local_2d8.ownFile.content.size_ = 0;
      (output->exception).ptr.field_1.value.file = local_2d8.file;
      *(undefined8 *)((long)&(output->exception).ptr.field_1 + 0x20) = local_2d8._32_8_;
      (output->exception).ptr.field_1.value.description.content.ptr =
           local_2d8.description.content.ptr;
      (output->exception).ptr.field_1.value.description.content.size_ =
           local_2d8.description.content.size_;
      (output->exception).ptr.field_1.value.description.content.disposer =
           local_2d8.description.content.disposer;
      local_2d8.description.content.ptr = (char *)0x0;
      local_2d8.description.content.size_ = 0;
      (output->exception).ptr.field_1.value.context.ptr.disposer = local_2d8.context.ptr.disposer;
      (output->exception).ptr.field_1.value.context.ptr.ptr = local_2d8.context.ptr.ptr;
      local_2d8.context.ptr.ptr = (Context *)0x0;
      memcpy((void *)((long)&(output->exception).ptr.field_1 + 0x50),local_2d8.trace,0x104);
      (output->exception).ptr.isSet = true;
    }
    Exception::~Exception(&local_2d8);
  }
  return;
}

Assistant:

void TransformPromiseNodeBase::get(ExceptionOrValue& output) noexcept {
  KJ_IF_MAYBE(exception, kj::runCatchingExceptions([&]() {
    getImpl(output);
    dropDependency();
  })) {
    output.addException(kj::mv(*exception));
  }
}